

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O1

int nsync::note_dequeue(void *v,nsync_waiter_s *nw)

{
  int iVar1;
  nsync_dll_list_ pnVar2;
  nsync_time *pnVar3;
  
  nsync_note_notified_deadline_((nsync_note)v);
  nsync_mu_lock((nsync_mu *)((long)v + 0x30));
  pnVar3 = (nsync_time *)&nsync_time_zero;
  if (*(int *)((long)v + 0x54) == 0) {
    if (*(int *)((long)v + 0x18) == 0) {
      pnVar3 = (nsync_time *)&nsync_time_no_deadline;
    }
    else {
      pnVar3 = (nsync_time *)((long)v + 0x20);
    }
  }
  iVar1 = nsync_time_cmp(*pnVar3,(nsync_time)ZEXT816(0));
  if (0 < iVar1) {
    pnVar2 = nsync_dll_remove_(*(nsync_dll_list_ *)((long)v + 0x68),&nw->q);
    *(nsync_dll_list_ *)((long)v + 0x68) = pnVar2;
    (nw->waiting).super___atomic_base<unsigned_int>._M_i = 0;
  }
  nsync_mu_unlock((nsync_mu *)((long)v + 0x30));
  return (uint)(0 < iVar1);
}

Assistant:

static int note_dequeue (void *v, struct nsync_waiter_s *nw) {
	int was_queued = 0;
	nsync_note n = (nsync_note) v;
	nsync_time ntime;
	nsync_note_notified_deadline_ (n);
	nsync_mu_lock (&n->note_mu);
	ntime = NOTIFIED_TIME (n);
	if (nsync_time_cmp (ntime, nsync_time_zero) > 0) {
		n->waiters = nsync_dll_remove_ (n->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 0);
		was_queued = 1;
	}
	nsync_mu_unlock (&n->note_mu);
	return (was_queued);
}